

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O0

void logfopen_callback(void *vctx,int mode)

{
  _Bool _Var1;
  FILE *pFVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  ptrlen data_00;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1c8;
  ptrlen data;
  _Bool shout;
  char *fmode;
  tm tm;
  char *event;
  char buf [256];
  LogContext *ctx;
  int mode_local;
  void *vctx_local;
  
  bVar5 = false;
  if (mode == 0) {
    *(undefined4 *)((long)vctx + 8) = 3;
  }
  else {
    pcVar3 = "wb";
    if (mode == 1) {
      pcVar3 = "ab";
    }
    pFVar2 = f_open(*(Filename **)((long)vctx + 0x38),pcVar3,false);
    *(FILE **)vctx = pFVar2;
    bVar5 = *vctx == 0;
    if (bVar5) {
      *(undefined4 *)((long)vctx + 8) = 3;
    }
    else {
      *(undefined4 *)((long)vctx + 8) = 2;
    }
  }
  if ((*(int *)((long)vctx + 8) == 2) &&
     (_Var1 = conf_get_bool(*(Conf **)((long)vctx + 0x48),0x85), _Var1)) {
    ltime();
    memcpy(&fmode,&data.len,0x38);
    strftime((char *)&event,0x18,"%Y.%m.%d %H:%M:%S",(tm *)&fmode);
    logprintf((LogContext *)vctx,"=~=~=~=~=~=~=~=~=~=~=~= PuTTY log %s =~=~=~=~=~=~=~=~=~=~=~=\r\n",
              &event);
  }
  if (*(int *)((long)vctx + 8) == 3) {
    local_1c8 = "Error writing";
    if (mode == 0) {
      local_1c8 = "Disabled writing";
    }
  }
  else {
    local_1c8 = "Writing new";
    if (mode == 1) {
      local_1c8 = "Appending";
    }
  }
  if (*(int *)((long)vctx + 0x50) == 1) {
    local_1d8 = "ASCII";
  }
  else {
    if (*(int *)((long)vctx + 0x50) == 2) {
      local_1e0 = "raw";
    }
    else {
      if (*(int *)((long)vctx + 0x50) == 3) {
        local_1e8 = "SSH packets";
      }
      else {
        local_1e8 = "unknown";
        if (*(int *)((long)vctx + 0x50) == 4) {
          local_1e8 = "SSH raw data";
        }
      }
      local_1e0 = local_1e8;
    }
    local_1d8 = local_1e0;
  }
  pcVar3 = filename_to_str(*(Filename **)((long)vctx + 0x38));
  tm.tm_zone = dupprintf("%s session log (%s mode) to file: %s",local_1c8,local_1d8,pcVar3);
  lp_eventlog(*(LogPolicy **)((long)vctx + 0x40),tm.tm_zone);
  if (bVar5) {
    lp_logging_error(*(LogPolicy **)((long)vctx + 0x40),tm.tm_zone);
  }
  safefree(tm.tm_zone);
  if (*(int *)((long)vctx + 8) == 1) {
    __assert_fail("ctx->state != L_OPENING",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/logging.c",0x8f
                  ,"void logfopen_callback(void *, int)");
  }
  while (sVar4 = bufchain_size((bufchain *)((long)vctx + 0x10)), sVar4 != 0) {
    data_00 = bufchain_prefix((bufchain *)((long)vctx + 0x10));
    logwrite((LogContext *)vctx,data_00);
    data.ptr = (void *)data_00.len;
    bufchain_consume((bufchain *)((long)vctx + 0x10),(size_t)data.ptr);
  }
  logflush((LogContext *)vctx);
  return;
}

Assistant:

static void logfopen_callback(void *vctx, int mode)
{
    LogContext *ctx = (LogContext *)vctx;
    char buf[256], *event;
    struct tm tm;
    const char *fmode;
    bool shout = false;

    if (mode == 0) {
        ctx->state = L_ERROR;          /* disable logging */
    } else {
        fmode = (mode == 1 ? "ab" : "wb");
        ctx->lgfp = f_open(ctx->currlogfilename, fmode, false);
        if (ctx->lgfp) {
            ctx->state = L_OPEN;
        } else {
            ctx->state = L_ERROR;
            shout = true;
        }
    }

    if (ctx->state == L_OPEN && conf_get_bool(ctx->conf, CONF_logheader)) {
        /* Write header line into log file. */
        tm = ltime();
        strftime(buf, 24, "%Y.%m.%d %H:%M:%S", &tm);
        logprintf(ctx, "=~=~=~=~=~=~=~=~=~=~=~= PuTTY log %s"
                  " =~=~=~=~=~=~=~=~=~=~=~=\r\n", buf);
    }

    event = dupprintf("%s session log (%s mode) to file: %s",
                      ctx->state == L_ERROR ?
                      (mode == 0 ? "Disabled writing" : "Error writing") :
                      (mode == 1 ? "Appending" : "Writing new"),
                      (ctx->logtype == LGTYP_ASCII ? "ASCII" :
                       ctx->logtype == LGTYP_DEBUG ? "raw" :
                       ctx->logtype == LGTYP_PACKETS ? "SSH packets" :
                       ctx->logtype == LGTYP_SSHRAW ? "SSH raw data" :
                       "unknown"),
                      filename_to_str(ctx->currlogfilename));
    lp_eventlog(ctx->lp, event);
    if (shout) {
        /*
         * If we failed to open the log file due to filesystem error
         * (as opposed to user action such as clicking Cancel in the
         * askappend box), we should log it more prominently.
         */
        lp_logging_error(ctx->lp, event);
    }
    sfree(event);

    /*
     * Having either succeeded or failed in opening the log file,
     * we should write any queued data out.
     */
    assert(ctx->state != L_OPENING);   /* make _sure_ it won't be requeued */
    while (bufchain_size(&ctx->queue)) {
        ptrlen data = bufchain_prefix(&ctx->queue);
        logwrite(ctx, data);
        bufchain_consume(&ctx->queue, data.len);
    }
    logflush(ctx);
}